

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivfenc.c
# Opt level: O0

void ivf_write_file_header(FILE *outfile,aom_codec_enc_cfg *cfg,uint fourcc,int frame_cnt)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  FILE *in_RDI;
  char header [32];
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 auStack_34 [2];
  undefined1 auStack_32 [2];
  undefined1 auStack_30 [4];
  undefined1 auStack_2c [2];
  undefined1 auStack_2a [2];
  undefined1 auStack_28 [4];
  undefined1 auStack_24 [4];
  undefined1 auStack_20 [4];
  undefined1 auStack_1c [4];
  int local_18;
  int local_14;
  long local_10;
  FILE *local_8;
  
  local_38 = 0x44;
  local_37 = 0x4b;
  local_36 = 0x49;
  local_35 = 0x46;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  mem_put_le16_as_int(auStack_34,0);
  mem_put_le16_as_int(auStack_32,0x20);
  mem_put_le32_as_int(auStack_30,local_14);
  mem_put_le16_as_int(auStack_2c,*(int *)(local_10 + 0xc));
  mem_put_le16_as_int(auStack_2a,*(int *)(local_10 + 0x10));
  mem_put_le32_as_int(auStack_28,*(int *)(local_10 + 0x2c));
  mem_put_le32_as_int(auStack_24,*(int *)(local_10 + 0x28));
  mem_put_le32_as_int(auStack_20,local_18);
  mem_put_le32_as_int(auStack_1c,0);
  fwrite(&local_38,1,0x20,local_8);
  return;
}

Assistant:

void ivf_write_file_header(FILE *outfile, const struct aom_codec_enc_cfg *cfg,
                           unsigned int fourcc, int frame_cnt) {
  char header[32];

  header[0] = 'D';
  header[1] = 'K';
  header[2] = 'I';
  header[3] = 'F';
  mem_put_le16(header + 4, 0);                     // version
  mem_put_le16(header + 6, 32);                    // header size
  mem_put_le32(header + 8, fourcc);                // fourcc
  mem_put_le16(header + 12, cfg->g_w);             // width
  mem_put_le16(header + 14, cfg->g_h);             // height
  mem_put_le32(header + 16, cfg->g_timebase.den);  // rate
  mem_put_le32(header + 20, cfg->g_timebase.num);  // scale
  mem_put_le32(header + 24, frame_cnt);            // length
  mem_put_le32(header + 28, 0);                    // unused

  fwrite(header, 1, 32, outfile);
}